

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O3

void __thiscall kj::_::Debug::Context::onRecoverableException(Context *this,Exception *exception)

{
  ExceptionCallback *pEVar1;
  char *pcVar2;
  size_t sVar3;
  Value_conflict v;
  Value_conflict local_40;
  
  ensureInitialized(&local_40,this);
  Exception::wrapContext(exception,local_40.file,local_40.line,&local_40.description);
  pEVar1 = (this->super_ExceptionCallback).next;
  (*pEVar1->_vptr_ExceptionCallback[2])(pEVar1,exception);
  sVar3 = local_40.description.content.size_;
  pcVar2 = local_40.description.content.ptr;
  if (local_40.description.content.ptr != (char *)0x0) {
    local_40.description.content.ptr = (char *)0x0;
    local_40.description.content.size_ = 0;
    (**(local_40.description.content.disposer)->_vptr_ArrayDisposer)
              (local_40.description.content.disposer,pcVar2,1,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void Debug::Context::onRecoverableException(Exception&& exception) {
  Value v = ensureInitialized();
  exception.wrapContext(v.file, v.line, mv(v.description));
  next.onRecoverableException(kj::mv(exception));
}